

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * __thiscall
CLI::ConfigINI::to_config
          (string *__return_storage_ptr__,ConfigINI *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  App *pAVar1;
  size_type sVar2;
  size_type sVar3;
  pointer puVar4;
  pointer pcVar5;
  string *psVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  long lVar11;
  long *plVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  long *plVar17;
  pointer ppAVar18;
  char cVar19;
  undefined7 in_register_00000081;
  ulong uVar20;
  bool bVar21;
  string value;
  string name;
  stringstream out;
  undefined1 local_328 [24];
  long lStack_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  _Any_data local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined4 local_2bc;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_2b8;
  pointer local_2a0;
  string local_298;
  string *local_278;
  long *local_270;
  long local_268;
  long local_260;
  undefined4 uStack_258;
  undefined4 uStack_254;
  string local_250;
  string *local_230;
  App *local_228;
  ConfigINI *local_220;
  long *local_218;
  long local_210;
  long local_208 [2];
  _Any_data local_1f8;
  code *local_1e8;
  undefined8 uStack_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_2bc = (undefined4)CONCAT71(in_register_00000081,write_description);
  local_278 = prefix;
  local_220 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e8 = (code *)0x0;
  uStack_1e0 = 0;
  App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_2b8,
                   app,(function<bool_(const_CLI::Option_*)> *)&local_1f8);
  local_230 = __return_storage_ptr__;
  local_228 = app;
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)((_Any_data *)&local_1f8,(_Any_data *)&local_1f8,__destroy_functor);
  }
  local_2a0 = local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar18 = local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar18;
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&(pAVar1->description_).field_2 + 8);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2e8,__x);
      if (local_2e8._M_unused._M_object == (void *)local_2e8._8_8_) {
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2e8);
      }
      else {
        cVar19 = (pAVar1->name_).field_2._M_local_buf[0xb];
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2e8);
        if (cVar19 == '\x01') {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_328,__x);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2e8,local_278,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_328._0_8_);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_328);
          local_328._0_8_ = local_328 + 0x10;
          local_328._8_8_ = (pointer)0x0;
          local_328._16_8_ = local_328._16_8_ & 0xffffffffffffff00;
          sVar2 = (pAVar1->group_).field_2._M_allocated_capacity;
          sVar3 = *(size_type *)((long)&(pAVar1->group_).field_2 + 8);
          if (*(int *)((long)&(pAVar1->failure_message_).super__Function_base._M_functor + 0xc) == 0
             ) {
            pcVar14 = "true";
            if (sVar3 - sVar2 == 0x20) {
LAB_00178d96:
              ::std::__cxx11::string::_M_replace((ulong)local_328,0,(char *)0x0,(ulong)pcVar14);
            }
            else {
              uVar20 = (long)(sVar3 - sVar2) >> 5;
              if (uVar20 < 2) {
                pcVar14 = "false";
                if (default_also && sVar3 == sVar2) goto LAB_00178d96;
              }
              else {
                cVar19 = '\x01';
                if (9 < uVar20) {
                  uVar15 = uVar20;
                  cVar7 = '\x04';
                  do {
                    cVar19 = cVar7;
                    if (uVar15 < 100) {
                      cVar19 = cVar19 + -2;
                      goto LAB_001792a8;
                    }
                    if (uVar15 < 1000) {
                      cVar19 = cVar19 + -1;
                      goto LAB_001792a8;
                    }
                    if (uVar15 < 10000) goto LAB_001792a8;
                    bVar21 = 99999 < uVar15;
                    uVar15 = uVar15 / 10000;
                    cVar7 = cVar19 + '\x04';
                  } while (bVar21);
                  cVar19 = cVar19 + '\x01';
                }
LAB_001792a8:
                local_308._M_allocated_capacity = (size_type)&local_2f8;
                ::std::__cxx11::string::_M_construct((ulong)&local_308,cVar19);
                ::std::__detail::__to_chars_10_impl<unsigned_long>
                          ((char *)local_308._M_allocated_capacity,local_308._8_4_,uVar20);
                ::std::__cxx11::string::operator=
                          ((string *)local_328,(string *)local_308._M_local_buf);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_308._M_allocated_capacity != &local_2f8) goto LAB_00178edc;
              }
            }
          }
          else if (sVar3 == sVar2) {
            if (default_also) {
              local_218 = local_208;
              sVar2 = (pAVar1->footer_)._M_string_length;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_218,sVar2,
                         (pAVar1->footer_).field_2._M_allocated_capacity + sVar2);
              bVar21 = local_210 != 0;
              if (local_218 != local_208) {
                operator_delete(local_218,local_208[0] + 1);
              }
            }
            else {
              bVar21 = false;
            }
            if (bVar21) {
              sVar2 = (pAVar1->footer_)._M_string_length;
              local_308._M_allocated_capacity = (size_type)&local_2f8;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_308,sVar2,
                         (pAVar1->footer_).field_2._M_allocated_capacity + sVar2);
              ::std::__cxx11::string::operator=
                        ((string *)local_328,(string *)local_308._M_local_buf);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_allocated_capacity != &local_2f8) {
LAB_00178edc:
                operator_delete((void *)local_308._M_allocated_capacity,
                                local_2f8._M_allocated_capacity + 1);
              }
            }
          }
          else {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_1d0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&(pAVar1->group_).field_2);
            detail::ini_join((string *)&local_308,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_1d0);
            ::std::__cxx11::string::operator=((string *)local_328,(string *)local_308._M_local_buf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_308._M_allocated_capacity != &local_2f8) {
              operator_delete((void *)local_308._M_allocated_capacity,
                              local_2f8._M_allocated_capacity + 1);
            }
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_1d0);
          }
          if ((pointer)local_328._8_8_ != (pointer)0x0) {
            if (((byte)local_2bc != '\0') &&
               ((pAVar1->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0)) {
              iVar8 = ::std::ostream::tellp();
              if (iVar8 != 0) {
                ::std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + (char)local_1a8);
                ::std::ostream::put((char)local_1a8);
                ::std::ostream::flush();
              }
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"; ",2);
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"; ","");
              local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
              puVar4 = (pAVar1->options_).
                       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_298,puVar4,
                         (long)&(((pAVar1->options_).
                                  super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                                .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl +
                         (long)puVar4);
              detail::fix_newlines((string *)&local_308,&local_250,&local_298);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_308._M_allocated_capacity,
                                   CONCAT44(local_308._12_4_,local_308._8_4_));
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              ::std::ostream::put((char)poVar10);
              ::std::ostream::flush();
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308._M_allocated_capacity != &local_2f8) {
                operator_delete((void *)local_308._M_allocated_capacity,
                                local_2f8._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._M_dataplus._M_p != &local_298.field_2) {
                operator_delete(local_298._M_dataplus._M_p,
                                local_298.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
            }
            iVar8 = *(int *)((long)&(pAVar1->failure_message_).super__Function_base._M_functor + 0xc
                            );
            iVar9 = *(int *)&(pAVar1->failure_message_).super__Function_base._M_manager;
            uVar13 = 0xffffffff;
            if ((*(int *)((long)&(pAVar1->name_).field_2 + 0xc) == 0) && (uVar13 = 1, iVar9 < 0)) {
              uVar13 = iVar8 >> 0x1f | 1;
            }
            iVar9 = iVar9 * iVar8;
            iVar8 = -iVar9;
            if (0 < iVar9) {
              iVar8 = iVar9;
            }
            if (iVar8 * uVar13 == 1) {
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_2e8._M_unused._0_8_,
                                   local_2e8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"=",1);
              cVar19 = *(char *)&((_Alloc_hider *)local_328._0_8_)->_M_p;
              if (((cVar19 != '\'') && (cVar19 != '\"')) ||
                 (cVar19 != ((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_328._0_8_ + -0x20))->field_2)._M_local_buf + 0xf)
                            [local_328._8_8_])) {
                cVar19 = (char)local_328;
                ::std::__cxx11::string::find(cVar19,0x22);
                ::std::__cxx11::string::find(cVar19,0x27);
                lVar11 = ::std::__cxx11::string::find(cVar19,0x20);
                if (lVar11 != -1) {
                  ::std::__cxx11::string::insert((ulong)local_328,0,'\x01');
                  ::std::__cxx11::string::_M_replace_aux((ulong)local_328,local_328._8_8_,0,'\x01');
                }
              }
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_328._0_8_,local_328._8_8_);
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            }
            else {
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_1a8,(char *)local_2e8._M_unused._0_8_,
                                   local_2e8._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"=",1);
              poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)local_328._0_8_,local_328._8_8_);
              ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            }
            ::std::ostream::put((char)poVar10);
            ::std::ostream::flush();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_328 + 0x10)) {
            operator_delete((void *)local_328._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_328._16_8_)->_M_p + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e8._M_unused._0_8_ != &local_2d8) {
            operator_delete(local_2e8._M_unused._M_object,local_2d8._M_allocated_capacity + 1);
          }
        }
      }
      ppAVar18 = ppAVar18 + 1;
    } while (ppAVar18 != local_2a0);
  }
  if (local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_2d8._M_allocated_capacity = 0;
  local_2d8._8_8_ = 0;
  local_2e8._M_unused._M_object =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2e8._8_8_ = 0;
  App::get_subcommands(&local_2b8,local_228,(function<bool_(const_CLI::App_*)> *)&local_2e8);
  if ((code *)local_2d8._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_2d8._M_allocated_capacity)(&local_2e8,&local_2e8,3);
  }
  local_2a0 = local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  if (local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar20 = (ulong)(byte)local_2bc;
    ppAVar18 = local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar18;
      local_308._M_allocated_capacity = (size_type)&local_2f8;
      pcVar5 = (pAVar1->name_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,pcVar5,pcVar5 + (pAVar1->name_)._M_string_length);
      plVar12 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&local_308,0,(char *)0x0,
                                   (ulong)(local_278->_M_dataplus)._M_p);
      local_328._0_8_ = local_328 + 0x10;
      pbVar16 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar12 + 2);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12 == pbVar16)
      {
        local_328._16_8_ = (pbVar16->_M_dataplus)._M_p;
        lStack_310 = plVar12[3];
      }
      else {
        local_328._16_8_ = (pbVar16->_M_dataplus)._M_p;
        local_328._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar12;
      }
      local_328._8_8_ = plVar12[1];
      *plVar12 = (long)pbVar16;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)::std::__cxx11::string::append(local_328);
      plVar17 = plVar12 + 2;
      if ((long *)*plVar12 == plVar17) {
        local_260 = *plVar17;
        uStack_258 = (undefined4)plVar12[3];
        uStack_254 = *(undefined4 *)((long)plVar12 + 0x1c);
        local_270 = &local_260;
      }
      else {
        local_260 = *plVar17;
        local_270 = (long *)*plVar12;
      }
      local_268 = plVar12[1];
      *plVar12 = (long)plVar17;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      (**(local_220->super_Config)._vptr_Config)
                (&local_2e8,local_220,pAVar1,(ulong)default_also,uVar20,&local_270);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_2e8._M_unused._0_8_,local_2e8._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_unused._0_8_ != &local_2d8) {
        operator_delete(local_2e8._M_unused._M_object,(ulong)(local_2d8._M_allocated_capacity + 1));
      }
      if (local_270 != &local_260) {
        operator_delete(local_270,local_260 + 1);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_328._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_allocated_capacity != &local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity,local_2f8._M_allocated_capacity + 1)
        ;
      }
      ppAVar18 = ppAVar18 + 1;
    } while (ppAVar18 != local_2a0);
  }
  if (local_2b8.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  psVar6 = local_230;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar6;
}

Assistant:

inline std::string
ConfigINI::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    for(const Option *opt : app->get_options({})) {

        // Only process option with a long-name and configurable
        if(!opt->get_lnames().empty() && opt->get_configurable()) {
            std::string name = prefix + opt->get_lnames()[0];
            std::string value;

            // Non-flags
            if(opt->get_type_size() != 0) {

                // If the option was found on command line
                if(opt->count() > 0)
                    value = detail::ini_join(opt->results());

                // If the option has a default and is requested by optional argument
                else if(default_also && !opt->get_defaultval().empty())
                    value = opt->get_defaultval();
                // Flag, one passed
            } else if(opt->count() == 1) {
                value = "true";

                // Flag, multiple passed
            } else if(opt->count() > 1) {
                value = std::to_string(opt->count());

                // Flag, not present
            } else if(opt->count() == 0 && default_also) {
                value = "false";
            }

            if(!value.empty()) {
                if(write_description && opt->has_description()) {
                    if(static_cast<int>(out.tellp()) != 0) {
                        out << std::endl;
                    }
                    out << "; " << detail::fix_newlines("; ", opt->get_description()) << std::endl;
                }

                // Don't try to quote anything that is not size 1
                if(opt->get_items_expected() != 1)
                    out << name << "=" << value << std::endl;
                else
                    out << name << "=" << detail::add_quotes_if_needed(value) << std::endl;
            }
        }
    }

    for(const App *subcom : app->get_subcommands({}))
        out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");

    return out.str();
}